

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O2

CURLcode output_auth_headers(Curl_easy *data,connectdata *conn,auth *authstatus,char *request,
                            char *path,_Bool proxy)

{
  char *pcVar1;
  CURLcode CVar2;
  long lVar3;
  unsigned_long uVar4;
  char *pcVar5;
  size_t insize;
  long lVar6;
  char *pcVar7;
  char *pcVar8;
  long lVar9;
  char *local_48;
  long local_40;
  size_t size;
  
  uVar4 = authstatus->picked;
  if (uVar4 == 1) {
    if (proxy) {
      if ((((uint)conn->bits & 4) == 0) ||
         (pcVar8 = Curl_checkProxyheaders(data,conn,"Proxy-authorization",0x13),
         pcVar8 != (char *)0x0)) goto LAB_005cac1d;
      lVar9 = 0x12d8;
      lVar6 = 0x1338;
      lVar3 = 0x1340;
LAB_005cad31:
      size = 0;
      local_48 = (char *)0x0;
      pcVar8 = *(char **)((long)&data->magic + lVar6);
      if (pcVar8 == (char *)0x0) {
        pcVar8 = "";
      }
      pcVar5 = *(char **)((long)&data->magic + lVar3);
      if (pcVar5 == (char *)0x0) {
        pcVar5 = "";
      }
      pcVar8 = curl_maprintf("%s:%s",pcVar8,pcVar5);
      if (pcVar8 == (char *)0x0) {
        return CURLE_OUT_OF_MEMORY;
      }
      local_40 = lVar9;
      insize = strlen(pcVar8);
      CVar2 = Curl_base64_encode(pcVar8,insize,&local_48,&size);
      lVar3 = local_40;
      if (CVar2 == CURLE_OK) {
        if (local_48 == (char *)0x0) {
          CVar2 = CURLE_REMOTE_ACCESS_DENIED;
        }
        else {
          (*Curl_cfree)(*(void **)((long)&data->magic + local_40));
          pcVar5 = "";
          if (proxy) {
            pcVar5 = "Proxy-";
          }
          pcVar5 = curl_maprintf("%sAuthorization: Basic %s\r\n",pcVar5,local_48);
          *(char **)((long)&data->magic + lVar3) = pcVar5;
          (*Curl_cfree)(local_48);
          CVar2 = CURLE_OUT_OF_MEMORY;
          if (*(long *)((long)&data->magic + lVar3) != 0) {
            CVar2 = CURLE_OK;
          }
        }
      }
      (*Curl_cfree)(pcVar8);
      if (CVar2 != CURLE_OK) {
        return CVar2;
      }
      pcVar8 = "Basic";
    }
    else {
      if (((data->state).aptr.user != (char *)0x0) &&
         (pcVar8 = Curl_checkheaders(data,"Authorization",0xd), pcVar8 == (char *)0x0)) {
        lVar9 = 0x12f0;
        lVar6 = 0x1328;
        lVar3 = 0x1330;
        goto LAB_005cad31;
      }
LAB_005cac1d:
      pcVar8 = (char *)0x0;
    }
    authstatus->field_0x18 = authstatus->field_0x18 | 1;
  }
  else if (uVar4 == 2) {
    CVar2 = Curl_output_digest(data,proxy,(uchar *)request,(uchar *)path);
    if (CVar2 != CURLE_OK) {
      return CVar2;
    }
    pcVar8 = "Digest";
  }
  else if (uVar4 == 8) {
    CVar2 = Curl_output_ntlm(data,proxy);
    if (CVar2 != CURLE_OK) {
      return CVar2;
    }
    pcVar8 = "NTLM";
  }
  else {
    if (uVar4 != 0x80) {
      pcVar8 = (char *)0x0;
      goto LAB_005cac31;
    }
    CVar2 = Curl_output_aws_sigv4(data,proxy);
    if (CVar2 != CURLE_OK) {
      return CVar2;
    }
    pcVar8 = "AWS_SIGV4";
  }
  uVar4 = authstatus->picked;
LAB_005cac31:
  if (uVar4 == 0x40) {
    if (((!proxy) && ((data->set).str[0x40] != (char *)0x0)) &&
       (pcVar5 = Curl_checkheaders(data,"Authorization",0xd), pcVar5 == (char *)0x0)) {
      (*Curl_cfree)((data->state).aptr.userpwd);
      pcVar8 = curl_maprintf("Authorization: Bearer %s\r\n",(data->set).str[0x40]);
      (data->state).aptr.userpwd = pcVar8;
      if (pcVar8 == (char *)0x0) {
        return CURLE_OUT_OF_MEMORY;
      }
      pcVar8 = "Bearer";
    }
    authstatus->field_0x18 = authstatus->field_0x18 | 1;
  }
  if (pcVar8 == (char *)0x0) {
    authstatus->field_0x18 = authstatus->field_0x18 & 0xfd;
  }
  else {
    if ((data != (Curl_easy *)0x0) && (((data->set).field_0x8bd & 0x10) != 0)) {
      pcVar5 = "Server";
      if (proxy) {
        pcVar5 = "Proxy";
      }
      pcVar1 = (&(data->state).aptr.user)[(ulong)proxy * 2];
      pcVar7 = "";
      if (pcVar1 != (char *)0x0) {
        pcVar7 = pcVar1;
      }
      Curl_infof(data,"%s auth using %s with user \'%s\'",pcVar5,pcVar8,pcVar7);
    }
    authstatus->field_0x18 =
         (authstatus->field_0x18 & 0xfd | authstatus->field_0x18 * '\x02' & 2U) ^ 2;
  }
  return CURLE_OK;
}

Assistant:

static CURLcode
output_auth_headers(struct Curl_easy *data,
                    struct connectdata *conn,
                    struct auth *authstatus,
                    const char *request,
                    const char *path,
                    bool proxy)
{
  const char *auth = NULL;
  CURLcode result = CURLE_OK;
  (void)conn;

#ifdef CURL_DISABLE_DIGEST_AUTH
  (void)request;
  (void)path;
#endif
#ifndef CURL_DISABLE_AWS
  if(authstatus->picked == CURLAUTH_AWS_SIGV4) {
    auth = "AWS_SIGV4";
    result = Curl_output_aws_sigv4(data, proxy);
    if(result)
      return result;
  }
  else
#endif
#ifdef USE_SPNEGO
  if(authstatus->picked == CURLAUTH_NEGOTIATE) {
    auth = "Negotiate";
    result = Curl_output_negotiate(data, conn, proxy);
    if(result)
      return result;
  }
  else
#endif
#ifdef USE_NTLM
  if(authstatus->picked == CURLAUTH_NTLM) {
    auth = "NTLM";
    result = Curl_output_ntlm(data, proxy);
    if(result)
      return result;
  }
  else
#endif
#if defined(USE_NTLM) && defined(NTLM_WB_ENABLED)
  if(authstatus->picked == CURLAUTH_NTLM_WB) {
    auth = "NTLM_WB";
    result = Curl_output_ntlm_wb(data, conn, proxy);
    if(result)
      return result;
  }
  else
#endif
#ifndef CURL_DISABLE_DIGEST_AUTH
  if(authstatus->picked == CURLAUTH_DIGEST) {
    auth = "Digest";
    result = Curl_output_digest(data,
                                proxy,
                                (const unsigned char *)request,
                                (const unsigned char *)path);
    if(result)
      return result;
  }
  else
#endif
#ifndef CURL_DISABLE_BASIC_AUTH
  if(authstatus->picked == CURLAUTH_BASIC) {
    /* Basic */
    if(
#ifndef CURL_DISABLE_PROXY
      (proxy && conn->bits.proxy_user_passwd &&
       !Curl_checkProxyheaders(data, conn, STRCONST("Proxy-authorization"))) ||
#endif
      (!proxy && data->state.aptr.user &&
       !Curl_checkheaders(data, STRCONST("Authorization")))) {
      auth = "Basic";
      result = http_output_basic(data, proxy);
      if(result)
        return result;
    }

    /* NOTE: this function should set 'done' TRUE, as the other auth
       functions work that way */
    authstatus->done = TRUE;
  }
#endif
#ifndef CURL_DISABLE_BEARER_AUTH
  if(authstatus->picked == CURLAUTH_BEARER) {
    /* Bearer */
    if((!proxy && data->set.str[STRING_BEARER] &&
        !Curl_checkheaders(data, STRCONST("Authorization")))) {
      auth = "Bearer";
      result = http_output_bearer(data);
      if(result)
        return result;
    }

    /* NOTE: this function should set 'done' TRUE, as the other auth
       functions work that way */
    authstatus->done = TRUE;
  }
#endif

  if(auth) {
#ifndef CURL_DISABLE_PROXY
    infof(data, "%s auth using %s with user '%s'",
          proxy ? "Proxy" : "Server", auth,
          proxy ? (data->state.aptr.proxyuser ?
                   data->state.aptr.proxyuser : "") :
          (data->state.aptr.user ?
           data->state.aptr.user : ""));
#else
    (void)proxy;
    infof(data, "Server auth using %s with user '%s'",
          auth, data->state.aptr.user ?
          data->state.aptr.user : "");
#endif
    authstatus->multipass = (!authstatus->done) ? TRUE : FALSE;
  }
  else
    authstatus->multipass = FALSE;

  return result;
}